

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int ncnn::get_little_cpu_count(void)

{
  int iVar1;
  
  try_initialize_global_cpu_info();
  try_initialize_global_cpu_info();
  iVar1 = CpuSet::num_enabled(&g_cpu_affinity_mask_little);
  return iVar1;
}

Assistant:

int get_little_cpu_count()
{
    try_initialize_global_cpu_info();
    return get_cpu_thread_affinity_mask(1).num_enabled();
}